

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_trace_file_base.cpp
# Opt level: O2

void __thiscall sc_core::sc_trace_file_base::~sc_trace_file_base(sc_trace_file_base *this)

{
  (this->super_sc_trace_file)._vptr_sc_trace_file = (_func_int **)&PTR___cxa_pure_virtual_00264588;
  (this->super_sc_object)._vptr_sc_object = (_func_int **)&PTR_print_002646c0;
  if (this->initialized_ == false) {
    sc_report_handler::report
              (SC_WARNING,"trace file closed before any cycles were traced, file not written",
               (this->filename_)._M_dataplus._M_p,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ucirvinelecs[P]systemc/src/sysc/tracing/sc_trace_file_base.cpp"
               ,99);
  }
  if ((FILE *)this->fp != (FILE *)0x0) {
    fclose((FILE *)this->fp);
  }
  std::__cxx11::string::_M_dispose();
  sc_object::~sc_object(&this->super_sc_object);
  return;
}

Assistant:

sc_trace_file_base::~sc_trace_file_base()
{
    if( !is_initialized() )
        SC_REPORT_WARNING( SC_ID_TRACING_CLOSE_EMPTY_FILE_, filename() );

    if( fp )
        fclose(fp);

#if SC_TRACING_PHASE_CALLBACKS_ == 0
    // unregister from simcontext
    sc_get_curr_simcontext()->remove_trace_file( this );
#endif
}